

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_id.cpp
# Opt level: O0

spv_result_t spvtools::val::UpdateIdUse(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t id;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  reference psVar2;
  Instruction *this_00;
  Instruction *def;
  uint32_t operand_id;
  spv_operand_type_t *type;
  spv_parsed_operand_t *operand;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *__range2;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  this = Instruction::operands(inst);
  __end2 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::begin(this);
  operand = (spv_parsed_operand_t *)
            std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_spv_parsed_operand_t_*,_std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>_>
                                     *)&operand), bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<const_spv_parsed_operand_t_*,_std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>_>
             ::operator*(&__end2);
    id = Instruction::word(inst,(ulong)psVar2->offset);
    bVar1 = spvIsIdType(psVar2->type);
    if (((bVar1) && (psVar2->type != SPV_OPERAND_TYPE_RESULT_ID)) &&
       (this_00 = ValidationState_t::FindDef(_,id), this_00 != (Instruction *)0x0)) {
      Instruction::RegisterUse(this_00,inst,(uint)psVar2->offset);
    }
    __gnu_cxx::
    __normal_iterator<const_spv_parsed_operand_t_*,_std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>_>
    ::operator++(&__end2);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t UpdateIdUse(ValidationState_t& _, const Instruction* inst) {
  for (auto& operand : inst->operands()) {
    const spv_operand_type_t& type = operand.type;
    const uint32_t operand_id = inst->word(operand.offset);
    if (spvIsIdType(type) && type != SPV_OPERAND_TYPE_RESULT_ID) {
      if (auto def = _.FindDef(operand_id))
        def->RegisterUse(inst, operand.offset);
    }
  }

  return SPV_SUCCESS;
}